

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O3

void __thiscall
WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::Enqueue(WorkerQueue<SearchResultsWriterWorker<Protein>,_std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *this,deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>
                *queueItem)

{
  size_t sVar1;
  undefined1 local_30 [8];
  unique_lock<std::mutex> lock;
  
  local_30 = (undefined1  [8])(this + 0x80);
  lock._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_30);
  lock._M_device._0_1_ = 1;
  sVar1 = QueueItemInfo<std::deque<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>,_std::allocator<std::pair<Sequence<Protein>,_std::deque<Hit<Protein>,_std::allocator<Hit<Protein>_>_>_>_>_>_>
          ::Count(queueItem);
  *(size_t *)(this + 0x100) = *(long *)(this + 0x100) + sVar1;
  std::
  deque<std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::allocator<std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>>>
  ::
  emplace_back<std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>>
            ((deque<std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>,std::allocator<std::deque<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>,std::allocator<std::pair<Sequence<Protein>,std::deque<Hit<Protein>,std::allocator<Hit<Protein>>>>>>>>
              *)(this + 0xb0),queueItem);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void Enqueue( QueueItem& queueItem ) {
    {
      std::unique_lock< std::mutex > lock( mQueueMutex );
      mTotalEnqueued += QueueItemInfo< QueueItem >::Count( queueItem );
      mQueue.push( std::move( queueItem ) );
    }

    // Send one worker to work
    mCondition.notify_one();
  }